

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O2

char * acutest_basename_(char *path)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strrchr(path,0x2f);
  pcVar2 = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = path;
  }
  return pcVar2;
}

Assistant:

static const char*
acutest_basename_(const char* path)
{
    const char* name;

    name = strrchr(path, '/');
    if(name != NULL)
        name++;
    else
        name = path;

#ifdef ACUTEST_WIN_
    {
        const char* alt_name;

        alt_name = strrchr(path, '\\');
        if(alt_name != NULL)
            alt_name++;
        else
            alt_name = path;

        if(alt_name > name)
            name = alt_name;
    }
#endif

    return name;
}